

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1-format-common.c
# Opt level: O2

void la_format_SEQUENCE_as_json(la_asn1_formatter_params p,la_asn1_formatter_func cb)

{
  asn_TYPE_member_s *paVar1;
  la_asn1_formatter_params lVar2;
  la_asn1_formatter_params lVar3;
  long *plVar4;
  int edx;
  long lVar5;
  long lVar6;
  la_asn1_formatter_params cb_p;
  
  lVar3 = p;
  la_json_object_start(p.vstr,p.label);
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < (p.td)->elements_count; lVar5 = lVar5 + 1) {
    paVar1 = (p.td)->elements;
    plVar4 = (long *)((long)*(int *)((long)&paVar1->memb_offset + lVar6) + (long)p.sptr);
    if (((*(byte *)((long)&paVar1->flags + lVar6) & 1) == 0) ||
       (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0)) {
      lVar2.td = (asn_TYPE_descriptor_t *)*(undefined8 *)((long)&paVar1->type + lVar6);
      lVar2.vstr = (la_vstring *)SUB168(lVar3._0_16_,0);
      lVar2.label = (char *)SUB168(lVar3._0_16_,8);
      lVar2.sptr = plVar4;
      lVar2.indent = p.indent;
      lVar2._36_4_ = p._36_4_;
      (*cb)(lVar2);
    }
    lVar6 = lVar6 + 0x40;
  }
  la_json_object_end(p.vstr);
  return;
}

Assistant:

void la_format_SEQUENCE_as_json(la_asn1_formatter_params p, la_asn1_formatter_func cb) {
	la_asn1_formatter_params cb_p = p;
	la_json_object_start(p.vstr, p.label);
	for(int edx = 0; edx < p.td->elements_count; edx++) {
		asn_TYPE_member_t *elm = &p.td->elements[edx];
		void const *memb_ptr;

		if(elm->flags & ATF_POINTER) {
			memb_ptr = *(void const * const *)((char const *)p.sptr + elm->memb_offset);
			if(!memb_ptr) {
				continue;
			}
		} else {
			memb_ptr = (void const *)((char const *)p.sptr + elm->memb_offset);
		}
		cb_p.td = elm->type;
		cb_p.sptr = memb_ptr;
		cb(cb_p);
	}
	la_json_object_end(p.vstr);
}